

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_writeFrameHeader
                 (void *dst,size_t dstCapacity,ZSTD_CCtx_params *params,U64 pledgedSrcSize,
                 U32 dictID)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  bool local_6d;
  void *local_68;
  size_t pos;
  BYTE frameHeaderDescriptionByte;
  U32 fcsCode;
  BYTE windowLogByte;
  U32 singleSegment;
  U32 windowSize;
  U32 checksumFlag;
  U32 dictIDSizeCode;
  U32 dictIDSizeCodeLength;
  BYTE *op;
  U32 dictID_local;
  U64 pledgedSrcSize_local;
  ZSTD_CCtx_params *params_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  cVar4 = (dictID != 0) + (0xff < dictID) + (0xffff < dictID);
  if ((params->fParams).noDictIDFlag != 0) {
    cVar4 = '\0';
  }
  iVar1 = (params->fParams).checksumFlag;
  bVar7 = (params->fParams).contentSizeFlag != 0;
  bVar6 = pledgedSrcSize <= (uint)(1 << ((byte)(params->cParams).windowLog & 0x1f));
  local_6d = bVar7 && bVar6;
  uVar2 = (params->cParams).windowLog;
  if ((params->fParams).contentSizeFlag == 0) {
    cVar5 = '\0';
  }
  else {
    cVar5 = (0xff < pledgedSrcSize) + (0x100ff < pledgedSrcSize) + (0xfffffffe < pledgedSrcSize);
  }
  local_68 = (void *)0x0;
  if (((params->fParams).contentSizeFlag != 0) && (pledgedSrcSize == 0xffffffffffffffff)) {
    __assert_fail("!(params->fParams.contentSizeFlag && pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1187,
                  "size_t ZSTD_writeFrameHeader(void *, size_t, const ZSTD_CCtx_params *, U64, U32)"
                 );
  }
  if (dstCapacity < 0x12) {
    dst_local = (void *)0xffffffffffffffba;
  }
  else {
    if (params->format == ZSTD_f_zstd1) {
      MEM_writeLE32(dst,0xfd2fb528);
      local_68 = (void *)0x4;
    }
    *(char *)((long)dst + (long)local_68) =
         cVar4 + (0 < iVar1) * '\x04' + local_6d * ' ' + cVar5 * '@';
    pvVar3 = (void *)((long)local_68 + 1);
    if (!bVar7 || !bVar6) {
      *(char *)((long)dst + (long)local_68 + 1) = ((char)uVar2 + -10) * '\b';
      pvVar3 = (void *)((long)local_68 + 2);
    }
    local_68 = pvVar3;
    switch(cVar4) {
    case '\0':
      break;
    case '\x01':
      *(char *)((long)dst + (long)local_68) = (char)dictID;
      local_68 = (void *)((long)local_68 + 1);
      break;
    case '\x02':
      MEM_writeLE16((void *)((long)dst + (long)local_68),(U16)dictID);
      local_68 = (void *)((long)local_68 + 2);
      break;
    case '\x03':
      MEM_writeLE32((void *)((long)dst + (long)local_68),dictID);
      local_68 = (void *)((long)local_68 + 4);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1195,
                    "size_t ZSTD_writeFrameHeader(void *, size_t, const ZSTD_CCtx_params *, U64, U32)"
                   );
    }
    switch(cVar5) {
    case '\0':
      if (local_6d) {
        *(char *)((long)dst + (long)local_68) = (char)pledgedSrcSize;
        local_68 = (void *)((long)local_68 + 1);
      }
      break;
    case '\x01':
      MEM_writeLE16((void *)((long)dst + (long)local_68),(short)pledgedSrcSize - 0x100);
      local_68 = (void *)((long)local_68 + 2);
      break;
    case '\x02':
      MEM_writeLE32((void *)((long)dst + (long)local_68),(U32)pledgedSrcSize);
      local_68 = (void *)((long)local_68 + 4);
      break;
    case '\x03':
      MEM_writeLE64((void *)((long)dst + (long)local_68),pledgedSrcSize);
      local_68 = (void *)((long)local_68 + 8);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x119f,
                    "size_t ZSTD_writeFrameHeader(void *, size_t, const ZSTD_CCtx_params *, U64, U32)"
                   );
    }
    dst_local = local_68;
  }
  return (size_t)dst_local;
}

Assistant:

static size_t ZSTD_writeFrameHeader(void* dst, size_t dstCapacity,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize, U32 dictID)
{   BYTE* const op = (BYTE*)dst;
    U32   const dictIDSizeCodeLength = (dictID>0) + (dictID>=256) + (dictID>=65536);   /* 0-3 */
    U32   const dictIDSizeCode = params->fParams.noDictIDFlag ? 0 : dictIDSizeCodeLength;   /* 0-3 */
    U32   const checksumFlag = params->fParams.checksumFlag>0;
    U32   const windowSize = (U32)1 << params->cParams.windowLog;
    U32   const singleSegment = params->fParams.contentSizeFlag && (windowSize >= pledgedSrcSize);
    BYTE  const windowLogByte = (BYTE)((params->cParams.windowLog - ZSTD_WINDOWLOG_ABSOLUTEMIN) << 3);
    U32   const fcsCode = params->fParams.contentSizeFlag ?
                     (pledgedSrcSize>=256) + (pledgedSrcSize>=65536+256) + (pledgedSrcSize>=0xFFFFFFFFU) : 0;  /* 0-3 */
    BYTE  const frameHeaderDescriptionByte = (BYTE)(dictIDSizeCode + (checksumFlag<<2) + (singleSegment<<5) + (fcsCode<<6) );
    size_t pos=0;

    assert(!(params->fParams.contentSizeFlag && pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN));
    RETURN_ERROR_IF(dstCapacity < ZSTD_FRAMEHEADERSIZE_MAX, dstSize_tooSmall,
                    "dst buf is too small to fit worst-case frame header size.");
    DEBUGLOG(4, "ZSTD_writeFrameHeader : dictIDFlag : %u ; dictID : %u ; dictIDSizeCode : %u",
                !params->fParams.noDictIDFlag, (unsigned)dictID, (unsigned)dictIDSizeCode);
    if (params->format == ZSTD_f_zstd1) {
        MEM_writeLE32(dst, ZSTD_MAGICNUMBER);
        pos = 4;
    }
    op[pos++] = frameHeaderDescriptionByte;
    if (!singleSegment) op[pos++] = windowLogByte;
    switch(dictIDSizeCode)
    {
        default:
            assert(0); /* impossible */
            ZSTD_FALLTHROUGH;
        case 0 : break;
        case 1 : op[pos] = (BYTE)(dictID); pos++; break;
        case 2 : MEM_writeLE16(op+pos, (U16)dictID); pos+=2; break;
        case 3 : MEM_writeLE32(op+pos, dictID); pos+=4; break;
    }
    switch(fcsCode)
    {
        default:
            assert(0); /* impossible */
            ZSTD_FALLTHROUGH;
        case 0 : if (singleSegment) op[pos++] = (BYTE)(pledgedSrcSize); break;
        case 1 : MEM_writeLE16(op+pos, (U16)(pledgedSrcSize-256)); pos+=2; break;
        case 2 : MEM_writeLE32(op+pos, (U32)(pledgedSrcSize)); pos+=4; break;
        case 3 : MEM_writeLE64(op+pos, (U64)(pledgedSrcSize)); pos+=8; break;
    }
    return pos;
}